

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O0

bool __thiscall
HighsPrimalHeuristics::linesearchRounding
          (HighsPrimalHeuristics *this,vector<double,_std::allocator<double>_> *point1,
          vector<double,_std::allocator<double>_> *point2,int solution_source)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  size_type sVar5;
  reference pvVar6;
  pointer pHVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  double *pdVar10;
  reference pvVar11;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  undefined8 *in_RDI;
  vector<double,_std::allocator<double>_> *pvVar12;
  double dVar13;
  double dVar14;
  double extraout_XMM0_Qa;
  double tmpalpha;
  double intpoint2;
  double convexcomb;
  HighsInt col;
  HighsInt i;
  bool reachedpoint2;
  double nextalpha;
  double alpha;
  HighsInt numintcols;
  vector<double,_std::allocator<double>_> roundedpoint;
  int in_stack_000058bc;
  vector<double,_std::allocator<double>_> *in_stack_000058c0;
  HighsPrimalHeuristics *in_stack_000058c8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee0;
  size_type in_stack_fffffffffffffee8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffef0;
  int local_70;
  double local_68;
  double local_60;
  vector<double,_std::allocator<double>_> local_40;
  vector<double,_std::allocator<double>_> *local_20;
  vector<double,_std::allocator<double>_> *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x673993);
  sVar5 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 10));
  HighsMipSolver::numCol((HighsMipSolver *)*in_RDI);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_60 = 0.0;
  do {
    if (1.0 <= local_60) {
      local_1 = 0;
LAB_00673f4a:
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffee0);
      return (bool)(local_1 & 1);
    }
    local_68 = 1.0;
    bVar3 = true;
    for (local_70 = 0; local_70 != (int)sVar5; local_70 = local_70 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 10),(long)local_70);
      iVar2 = *pvVar6;
      pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x673a77);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&pHVar7->uplocks,(long)iVar2);
      if (*pvVar6 == 0) {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)iVar2);
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)iVar2);
        pdVar10 = std::max<double>(pvVar8,pvVar9);
        dVar13 = *pdVar10;
        pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x673b0c);
        dVar13 = ceil(dVar13 - pHVar7->feastol);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)iVar2);
        *pvVar11 = dVar13;
      }
      else {
        pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x673b8c);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&pHVar7->downlocks,(long)iVar2);
        if (*pvVar6 == 0) {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)iVar2);
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)iVar2);
          pdVar10 = std::min<double>(pvVar8,pvVar9);
          dVar13 = *pdVar10;
          pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x673c15);
          dVar13 = floor(dVar13 + pHVar7->feastol);
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)iVar2);
          *pvVar11 = dVar13;
        }
        else {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)iVar2);
          dVar13 = *pvVar8;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)iVar2);
          dVar1 = *pvVar8;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)iVar2);
          dVar14 = floor(*pvVar8 + 0.5);
          dVar13 = floor((1.0 - local_60) * dVar13 + local_60 * dVar1 + 0.5);
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)iVar2);
          *pvVar11 = dVar13;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)iVar2);
          if ((*pvVar11 != dVar14) || (NAN(*pvVar11) || NAN(dVar14))) {
            bVar3 = false;
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                (&local_40,(long)iVar2);
            dVar13 = *pvVar11;
            pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x673db5);
            in_stack_fffffffffffffee0 =
                 (vector<double,_std::allocator<double>_> *)(dVar13 + 0.5 + pHVar7->feastol);
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)iVar2);
            dVar13 = (double)in_stack_fffffffffffffee0 - *pvVar8;
            std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)iVar2);
            pvVar12 = local_18;
            std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)iVar2);
            std::abs((int)pvVar12);
            dVar13 = dVar13 / extraout_XMM0_Qa;
            if ((dVar13 < local_68) && (local_60 + 0.01 < dVar13)) {
              local_68 = dVar13;
            }
          }
        }
      }
    }
    bVar4 = tryRoundedPoint(in_stack_000058c8,in_stack_000058c0,in_stack_000058bc);
    if (bVar4) {
      local_1 = 1;
      goto LAB_00673f4a;
    }
    if (bVar3) {
      local_1 = 0;
      goto LAB_00673f4a;
    }
    local_60 = local_68;
  } while( true );
}

Assistant:

bool HighsPrimalHeuristics::linesearchRounding(
    const std::vector<double>& point1, const std::vector<double>& point2,
    const int solution_source) {
  std::vector<double> roundedpoint;

  HighsInt numintcols = intcols.size();
  roundedpoint.resize(mipsolver.numCol());

  double alpha = 0.0;
  assert(int(mipsolver.mipdata_->uplocks.size()) == mipsolver.numCol());
  assert(int(point1.size()) == mipsolver.numCol());
  assert(int(point2.size()) == mipsolver.numCol());

  while (alpha < 1.0) {
    double nextalpha = 1.0;
    bool reachedpoint2 = true;
    // printf("trying alpha = %g\n", alpha);
    for (HighsInt i = 0; i != numintcols; ++i) {
      HighsInt col = intcols[i];
      assert(col >= 0);
      assert(col < mipsolver.numCol());
      if (mipsolver.mipdata_->uplocks[col] == 0) {
        roundedpoint[col] = std::ceil(std::max(point1[col], point2[col]) -
                                      mipsolver.mipdata_->feastol);
        continue;
      }

      if (mipsolver.mipdata_->downlocks[col] == 0) {
        roundedpoint[col] = std::floor(std::min(point1[col], point2[col]) +
                                       mipsolver.mipdata_->feastol);
        continue;
      }

      double convexcomb = (1.0 - alpha) * point1[col] + alpha * point2[col];
      double intpoint2 = std::floor(point2[col] + 0.5);
      roundedpoint[col] = std::floor(convexcomb + 0.5);

      if (roundedpoint[col] == intpoint2) continue;

      reachedpoint2 = false;
      double tmpalpha = (roundedpoint[col] + 0.5 + mipsolver.mipdata_->feastol -
                         point1[col]) /
                        std::abs(point2[col] - point1[col]);
      if (tmpalpha < nextalpha && tmpalpha > alpha + 1e-2) nextalpha = tmpalpha;
    }

    if (tryRoundedPoint(roundedpoint, solution_source)) return true;

    if (reachedpoint2) return false;

    alpha = nextalpha;
  }

  return false;
}